

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

void sg14::retain_traits<ThreadSafeBase>::increment<ThreadSafeBase,void>
               (atomic_reference_count<ThreadSafeBase> *ptr)

{
  atomic_reference_count<ThreadSafeBase> *ptr_local;
  
  LOCK();
  (ptr->count).super___atomic_base<long>._M_i = (ptr->count).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

static void increment (atomic_reference_count<U>* ptr) noexcept {
    ptr->count.fetch_add(1, std::memory_order_relaxed);
  }